

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv_error.cpp
# Opt level: O0

CSVError * __thiscall
duckdb::CSVErrorHandler::GetFirstError(CSVErrorHandler *this,CSVErrorType error_type)

{
  bool bVar1;
  InternalException *this_00;
  CSVErrorType in_DL;
  CSVError *in_RSI;
  CSVError *in_RDI;
  CSVError *er;
  iterator __end1;
  iterator __begin1;
  vector<duckdb::CSVError,_true> *__range1;
  lock_guard<std::mutex> parallel_lock;
  string *in_stack_ffffffffffffff58;
  __normal_iterator<duckdb::CSVError_*,_std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>_>
  *in_stack_ffffffffffffff60;
  allocator local_71;
  string local_70 [48];
  reference local_40;
  CSVError *local_38;
  __normal_iterator<duckdb::CSVError_*,_std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>_>
  local_30;
  LinesPerBoundary *local_28;
  CSVErrorType local_11;
  
  local_11 = in_DL;
  ::std::lock_guard<std::mutex>::lock_guard
            ((lock_guard<std::mutex> *)in_stack_ffffffffffffff60,
             (mutex_type *)in_stack_ffffffffffffff58);
  local_28 = &in_RSI->error_info;
  local_30._M_current =
       (CSVError *)
       ::std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>::begin
                 ((vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_> *)
                  in_stack_ffffffffffffff58);
  local_38 = (CSVError *)
             ::std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>::end
                       ((vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_> *)
                        in_stack_ffffffffffffff58);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_stack_ffffffffffffff60,
                       (__normal_iterator<duckdb::CSVError_*,_std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>_>
                        *)in_stack_ffffffffffffff58);
    if (!bVar1) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      ::std::allocator<char>::allocator();
      ::std::__cxx11::string::string
                (local_70,
                 "CSVErrorHandler::GetFirstError was called without having an appropriate error type"
                 ,&local_71);
      InternalException::InternalException(this_00,in_stack_ffffffffffffff58);
      __cxa_throw(this_00,&InternalException::typeinfo,InternalException::~InternalException);
    }
    local_40 = __gnu_cxx::
               __normal_iterator<duckdb::CSVError_*,_std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>_>
               ::operator*(&local_30);
    if (local_40->type == local_11) break;
    __gnu_cxx::
    __normal_iterator<duckdb::CSVError_*,_std::vector<duckdb::CSVError,_std::allocator<duckdb::CSVError>_>_>
    ::operator++(&local_30);
  }
  CSVError::CSVError(in_RSI,in_RDI);
  ::std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x17c85a3);
  return in_RDI;
}

Assistant:

CSVError CSVErrorHandler::GetFirstError(CSVErrorType error_type) {
	lock_guard<mutex> parallel_lock(main_mutex);
	for (const auto &er : errors) {
		if (er.type == error_type) {
			return er;
		}
	}
	throw InternalException("CSVErrorHandler::GetFirstError was called without having an appropriate error type");
}